

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes_parser.cc
# Opt level: O0

bool __thiscall
libwebm::VpxPesParser::RemoveStartCodeEmulationPreventionBytes
          (VpxPesParser *this,uint8_t *raw_data,size_t bytes_required,PacketData *processed_data,
          size_t *bytes_consumed)

{
  const_reference pvVar1;
  size_type sVar2;
  value_type local_5a;
  char local_59;
  uint8_t byte;
  long lStack_58;
  bool skip;
  size_t i;
  uint8_t *end_of_input;
  size_t bytes_copied;
  size_t num_zeros;
  size_t *bytes_consumed_local;
  PacketData *processed_data_local;
  size_t bytes_required_local;
  uint8_t *raw_data_local;
  VpxPesParser *this_local;
  
  if ((bytes_required == 0) || (processed_data == (PacketData *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    bytes_copied = 0;
    end_of_input = (uint8_t *)0x0;
    num_zeros = (size_t)bytes_consumed;
    bytes_consumed_local = (size_t *)processed_data;
    processed_data_local = (PacketData *)bytes_required;
    bytes_required_local = (size_t)raw_data;
    raw_data_local = (uint8_t *)this;
    pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x58),0);
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x58));
    i = (size_t)(pvVar1 + sVar2);
    lStack_58 = 0;
    while (end_of_input < processed_data_local) {
      if (i < bytes_required_local + lStack_58) {
        return false;
      }
      local_59 = '\0';
      local_5a = *(value_type *)(bytes_required_local + lStack_58);
      if (local_5a == '\0') {
        bytes_copied = bytes_copied + 1;
      }
      else {
        if ((local_5a == '\x03') && (bytes_copied == 2)) {
          local_59 = '\x01';
        }
        bytes_copied = 0;
      }
      if (local_59 == '\0') {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)bytes_consumed_local,
                   &local_5a);
        end_of_input = end_of_input + 1;
      }
      lStack_58 = lStack_58 + 1;
    }
    *(long *)num_zeros = lStack_58;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool VpxPesParser::RemoveStartCodeEmulationPreventionBytes(
    const std::uint8_t* raw_data, std::size_t bytes_required,
    PacketData* processed_data, std::size_t* bytes_consumed) const {
  if (bytes_required == 0 || !processed_data)
    return false;

  std::size_t num_zeros = 0;
  std::size_t bytes_copied = 0;
  const std::uint8_t* const end_of_input =
      &pes_file_data_[0] + pes_file_data_.size();
  std::size_t i;
  for (i = 0; bytes_copied < bytes_required; ++i) {
    if (raw_data + i > end_of_input)
      return false;

    bool skip = false;

    const std::uint8_t byte = raw_data[i];
    if (byte == 0) {
      ++num_zeros;
    } else if (byte == 0x3 && num_zeros == 2) {
      skip = true;
      num_zeros = 0;
    } else {
      num_zeros = 0;
    }

    if (skip == false) {
      processed_data->push_back(byte);
      ++bytes_copied;
    }
  }
  *bytes_consumed = i;
  return true;
}